

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::file_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,file_error_alert *this)

{
  char *pcVar1;
  string local_128;
  string local_108;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  file_error_alert *local_18;
  file_error_alert *this_local;
  
  local_18 = this;
  this_local = (file_error_alert *)__return_storage_ptr__;
  torrent_alert::message_abi_cxx11_(&local_d8,&this->super_torrent_alert);
  std::operator+(&local_b8,&local_d8," ");
  pcVar1 = operation_name(this->op);
  std::operator+(&local_98,&local_b8,pcVar1);
  std::operator+(&local_78,&local_98," (");
  pcVar1 = filename(this);
  std::operator+(&local_58,&local_78,pcVar1);
  std::operator+(&local_38,&local_58,") error: ");
  boost::system::error_code::message_abi_cxx11_(&local_128,&this->error);
  convert_from_native(&local_108,&local_128);
  std::operator+(__return_storage_ptr__,&local_38,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  return __return_storage_ptr__;
}

Assistant:

std::string file_error_alert::message() const
	{
		return torrent_alert::message() + " "
			+ operation_name(op) + " (" + filename()
			+ ") error: " + convert_from_native(error.message());
	}